

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O3

int speed_segment_start(mixed_segment *segment)

{
  long *plVar1;
  int iVar2;
  
  plVar1 = (long *)segment->data;
  if ((SRC_STATE *)plVar1[2] != (SRC_STATE *)0x0) {
    src_reset((SRC_STATE *)plVar1[2]);
  }
  if ((plVar1[1] == 0) || (iVar2 = 1, *plVar1 == 0)) {
    mixed_err(0x16);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int speed_segment_start(struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  if(data->resample_state)
    src_reset(data->resample_state);
  if(data->out == 0 || data->in == 0){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }
  return 1;
}